

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t
exr_get_display_window(exr_const_context_t_conflict ctxt,int part_index,exr_attr_box2i_t *out)

{
  exr_priv_part_t p_Var1;
  exr_attr_v2i_t eVar2;
  exr_result_t eVar3;
  exr_attribute_t *peVar4;
  exr_context_t nonc;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    eVar3 = 2;
  }
  else {
    if (ctxt->mode == '\x01') {
      pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
    }
    if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar3 = (*ctxt->print_error)
                        (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                         ctxt->print_error);
      return eVar3;
    }
    if (out == (exr_attr_box2i_t *)0x0) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar3 = (*ctxt->print_error)
                        (ctxt,3,"NULL output for \'%s\'","displayWindow",ctxt->print_error);
      return eVar3;
    }
    p_Var1 = ctxt->parts[(uint)part_index];
    peVar4 = p_Var1->displayWindow;
    if (peVar4 == (exr_attribute_t *)0x0) {
      eVar3 = 0xf;
    }
    else {
      if (peVar4->type != EXR_ATTR_BOX2I) {
        if (ctxt->mode == '\x01') {
          pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
          peVar4 = p_Var1->displayWindow;
        }
        eVar3 = (*ctxt->print_error)
                          (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                           peVar4->type_name,"displayWindow",ctxt->print_error);
        return eVar3;
      }
      eVar2 = ((peVar4->field_6).box2i)->max;
      out->min = ((peVar4->field_6).box2i)->min;
      out->max = eVar2;
      eVar3 = 0;
    }
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_get_display_window (
    exr_const_context_t ctxt, int part_index, exr_attr_box2i_t* out)
{
    REQ_ATTR_GET_IMPL_DEREF (displayWindow, box2i, EXR_ATTR_BOX2I);
}